

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O2

void __thiscall
tchecker::parsing::system::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  symbol_kind_type sVar1;
  filename_type *pfVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  counter_type cVar6;
  value_type *this_00;
  
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.state = s
  ;
  *(undefined8 *)
   &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   8) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x10) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x18) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x30) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x20) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x28) = 0;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.yytypeid_ =
       (type_info *)0x0;
  pfVar2 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
           filename;
  cVar5 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
          line;
  cVar6 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.begin.
          column;
  cVar3 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.line
  ;
  cVar4 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.
          column;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).location.end.
       filename;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.line =
       cVar3;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.column =
       cVar4;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.filename
       = pfVar2;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.line =
       cVar5;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.column =
       cVar6;
  sVar1 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).super_by_kind.
          kind_;
  if ((uint)(sVar1 + ~S_TOK_EVENT) < 0x19) {
    this_00 = &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value;
    switch(sVar1) {
    case S_TOK_ID:
    case S_TOK_INTEGER:
    case S_TOK_TEXT:
    case S_text_or_empty:
      value_type::move<std::__cxx11::string>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_attr_list:
    case S_non_empty_attr_list:
      value_type::move<tchecker::parsing::attributes_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_attr:
      value_type::move<std::shared_ptr<tchecker::parsing::attr_t>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_sync_constraint_list:
      value_type::
      move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_sync_constraint:
      value_type::move<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_sync_strength:
      value_type::move<tchecker::sync_strength_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_integer:
      value_type::move<int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
      break;
    case S_uinteger:
      value_type::move<unsigned_int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).
                          value);
    }
  }
  (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_kind>).super_by_kind.kind_ =
       S_YYEMPTY;
  return;
}

Assistant:

parser_t::by_state::by_state (state_type s) YY_NOEXCEPT
    : state (s)
  {}